

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O3

void libwebm::vttdemux::BuildMap(Segment *segment,metadata_map_t *map_ptr)

{
  int iVar1;
  long in_RAX;
  Chapters *pCVar2;
  mapped_type *pmVar3;
  Tracks *this;
  unsigned_long uVar4;
  Track *this_00;
  char *__s1;
  Type TVar5;
  long idx;
  unsigned_long idx_00;
  long tn;
  key_type local_38;
  
  local_38 = in_RAX;
  std::
  _Rb_tree<long,_std::pair<const_long,_libwebm::vttdemux::MetadataInfo>,_std::_Select1st<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
  ::clear(&map_ptr->_M_t);
  pCVar2 = mkvparser::Segment::GetChapters(segment);
  if (pCVar2 != (Chapters *)0x0) {
    local_38 = 0;
    pmVar3 = std::
             map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
             ::operator[](map_ptr,&local_38);
    pmVar3->type = kChapters;
    pmVar3->file = (FILE *)0x0;
  }
  this = mkvparser::Segment::GetTracks(segment);
  if (this != (Tracks *)0x0) {
    uVar4 = mkvparser::Tracks::GetTracksCount(this);
    if (0 < (long)uVar4) {
      idx_00 = 0;
      do {
        this_00 = mkvparser::Tracks::GetTrackByIndex(this,idx_00);
        if (this_00 != (Track *)0x0) {
          local_38 = mkvparser::Track::GetNumber(this_00);
          if (0 < local_38) {
            __s1 = mkvparser::Track::GetCodecId(this_00);
            if (__s1 != (char *)0x0) {
              iVar1 = strcmp(__s1,"D_WEBVTT/SUBTITLES");
              if (iVar1 == 0) {
                TVar5 = kSubtitles;
              }
              else {
                iVar1 = strcmp(__s1,"D_WEBVTT/CAPTIONS");
                if (iVar1 == 0) {
                  TVar5 = kCaptions;
                }
                else {
                  iVar1 = strcmp(__s1,"D_WEBVTT/DESCRIPTIONS");
                  if (iVar1 == 0) {
                    TVar5 = kDescriptions;
                  }
                  else {
                    iVar1 = strcmp(__s1,"D_WEBVTT/METADATA");
                    if (iVar1 != 0) goto LAB_0010c711;
                    TVar5 = kMetadata;
                  }
                }
              }
              pmVar3 = std::
                       map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                       ::operator[](map_ptr,&local_38);
              pmVar3->type = TVar5;
              pmVar3->file = (FILE *)0x0;
            }
          }
        }
LAB_0010c711:
        idx_00 = idx_00 + 1;
      } while (uVar4 != idx_00);
    }
  }
  return;
}

Assistant:

void vttdemux::BuildMap(const mkvparser::Segment* segment,
                        metadata_map_t* map_ptr) {
  metadata_map_t& m = *map_ptr;
  m.clear();

  if (segment->GetChapters()) {
    MetadataInfo info;
    info.file = NULL;
    info.type = MetadataInfo::kChapters;

    m[kChaptersKey] = info;
  }

  const mkvparser::Tracks* const tt = segment->GetTracks();
  if (tt == NULL)
    return;

  const long tc = tt->GetTracksCount();  // NOLINT
  if (tc <= 0)
    return;

  // Iterate over the tracks in the intput file.  We determine whether
  // a track holds metadata by inspecting its CodecID.

  for (long idx = 0; idx < tc; ++idx) {  // NOLINT
    const mkvparser::Track* const t = tt->GetTrackByIndex(idx);

    if (t == NULL)  // weird
      continue;

    const long tn = t->GetNumber();  // NOLINT

    if (tn <= 0)  // weird
      continue;

    const char* const codec_id = t->GetCodecId();

    if (codec_id == NULL)  // weird
      continue;

    MetadataInfo info;
    info.file = NULL;

    if (strcmp(codec_id, "D_WEBVTT/SUBTITLES") == 0) {
      info.type = MetadataInfo::kSubtitles;
    } else if (strcmp(codec_id, "D_WEBVTT/CAPTIONS") == 0) {
      info.type = MetadataInfo::kCaptions;
    } else if (strcmp(codec_id, "D_WEBVTT/DESCRIPTIONS") == 0) {
      info.type = MetadataInfo::kDescriptions;
    } else if (strcmp(codec_id, "D_WEBVTT/METADATA") == 0) {
      info.type = MetadataInfo::kMetadata;
    } else {
      continue;
    }

    m[tn] = info;  // create an entry in the cache for this track
  }
}